

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app_writer.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  mbedtls_pk_type_t mVar3;
  uint uVar4;
  char *pcVar5;
  FILE *pFVar6;
  size_t sVar7;
  mbedtls_mpi *X;
  int iVar8;
  char *pcVar9;
  char *__s1;
  uchar *puVar10;
  long lVar11;
  mbedtls_pk_context key;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  char buf [1024];
  uchar local_3eb8 [16000];
  uchar auStack_38 [8];
  
  mbedtls_pk_init(&key);
  memset(buf,0,0x400);
  mbedtls_mpi_init(&N);
  mbedtls_mpi_init(&P);
  mbedtls_mpi_init(&Q);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&DP);
  mbedtls_mpi_init(&DQ);
  mbedtls_mpi_init(&QP);
  if (argc == 0) {
LAB_0010b62f:
    printf(
          "\n usage: key_app_writer param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    output_mode=private|public default: none\n    output_file=%%s      default: keyfile.pem\n    output_format=pem|der default: pem\n\n"
          );
LAB_0010b640:
    iVar2 = 1;
  }
  else {
    opt.mode = 0;
    opt.filename = "keyfile.key";
    opt.output_mode = 0;
    opt.output_file = "keyfile.pem";
    opt.output_format = 0;
    for (lVar11 = 1; lVar11 < argc; lVar11 = lVar11 + 1) {
      pcVar9 = argv[lVar11];
      pcVar5 = strchr(pcVar9,0x3d);
      if (pcVar5 == (char *)0x0) goto LAB_0010b62f;
      __s1 = pcVar5 + 1;
      *pcVar5 = '\0';
      iVar2 = strcmp(pcVar9,"mode");
      if (iVar2 == 0) {
        iVar2 = strcmp(__s1,"private");
        if (iVar2 == 0) {
          opt.mode = 1;
          pcVar5 = opt.filename;
          pcVar1 = opt.output_file;
        }
        else {
          iVar2 = strcmp(__s1,"public");
          if (iVar2 != 0) goto LAB_0010b62f;
          opt.mode = 2;
          pcVar5 = opt.filename;
          pcVar1 = opt.output_file;
        }
      }
      else {
        iVar2 = strcmp(pcVar9,"output_mode");
        if (iVar2 == 0) {
          iVar2 = strcmp(__s1,"private");
          if (iVar2 == 0) {
            opt.output_mode = 1;
            pcVar5 = opt.filename;
            pcVar1 = opt.output_file;
          }
          else {
            iVar2 = strcmp(__s1,"public");
            if (iVar2 != 0) goto LAB_0010b62f;
            opt.output_mode = 2;
            pcVar5 = opt.filename;
            pcVar1 = opt.output_file;
          }
        }
        else {
          iVar2 = strcmp(pcVar9,"output_format");
          if (iVar2 == 0) {
            iVar2 = strcmp(__s1,"pem");
            if (iVar2 == 0) {
              opt.output_format = 0;
              pcVar5 = opt.filename;
              pcVar1 = opt.output_file;
            }
            else {
              iVar2 = strcmp(__s1,"der");
              if (iVar2 != 0) goto LAB_0010b62f;
              opt.output_format = 1;
              pcVar5 = opt.filename;
              pcVar1 = opt.output_file;
            }
          }
          else {
            iVar2 = strcmp(pcVar9,"filename");
            pcVar5 = __s1;
            pcVar1 = opt.output_file;
            if ((iVar2 != 0) &&
               (iVar2 = strcmp(pcVar9,"output_file"), pcVar5 = opt.filename, pcVar1 = __s1,
               iVar2 != 0)) goto LAB_0010b62f;
          }
        }
      }
      opt.output_file = pcVar1;
      opt.filename = pcVar5;
    }
    if (opt.output_mode != 0 && opt.mode == 0) {
      puts("\nCannot output a key without reading one.");
      goto LAB_0010b640;
    }
    if (opt.output_mode == 1 && opt.mode == 2) {
      puts("\nCannot output a private key from a public key.");
      goto LAB_0010b640;
    }
    if (opt.mode == 1) {
      printf("\n  . Loading the private key ...");
      fflush(_stdout);
      iVar2 = mbedtls_pk_parse_keyfile(&key,opt.filename,(char *)0x0);
      if (iVar2 == 0) {
        puts(" ok");
        puts("  . Key information    ...");
        mVar3 = mbedtls_pk_get_type(&key);
        if (mVar3 == MBEDTLS_PK_RSA) {
          iVar2 = mbedtls_rsa_export((mbedtls_rsa_context *)key.pk_ctx,&N,&P,&Q,&D,&E);
          if ((iVar2 != 0) ||
             (iVar2 = mbedtls_rsa_export_crt((mbedtls_rsa_context *)key.pk_ctx,&DP,&DQ,&QP),
             iVar2 != 0)) {
LAB_0010b85d:
            puts(" failed\n  ! could not export RSA parameters\n");
            goto LAB_0010b642;
          }
          mbedtls_mpi_write_file("N:  ",&N,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("E:  ",&E,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("D:  ",&D,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("P:  ",&P,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("Q:  ",&Q,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("DP: ",&DP,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("DQ:  ",&DQ,0x10,(FILE *)0x0);
          pcVar9 = "QP:  ";
          X = &QP;
LAB_0010b96a:
          mbedtls_mpi_write_file(pcVar9,X,0x10,(FILE *)0x0);
        }
        else {
          mVar3 = mbedtls_pk_get_type(&key);
          if (mVar3 == MBEDTLS_PK_ECKEY) {
            mbedtls_mpi_write_file
                      ("Q(X): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x110),0x10,(FILE *)0x0);
            mbedtls_mpi_write_file
                      ("Q(Y): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x128),0x10,(FILE *)0x0);
            mbedtls_mpi_write_file
                      ("Q(Z): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x140),0x10,(FILE *)0x0);
            X = (mbedtls_mpi *)((long)key.pk_ctx + 0xf8);
            pcVar9 = "D   : ";
            goto LAB_0010b96a;
          }
LAB_0010b936:
          puts("key type not supported yet");
        }
        pcVar9 = opt.output_file;
        if (opt.output_mode == 2) {
          memset(local_3eb8,0,16000);
          if (opt.output_format == 0) {
            puVar10 = local_3eb8;
            iVar2 = mbedtls_pk_write_pubkey_pem(&key,puVar10,16000);
            if (iVar2 == 0) {
              sVar7 = strlen((char *)puVar10);
              goto LAB_0010b9f6;
            }
          }
          else {
            uVar4 = mbedtls_pk_write_pubkey_der(&key,local_3eb8,16000);
            if (-1 < (int)uVar4) {
              sVar7 = (size_t)uVar4;
              puVar10 = auStack_38 + -sVar7;
LAB_0010b9f6:
              pFVar6 = fopen(pcVar9,"w");
              if (pFVar6 != (FILE *)0x0) {
                fwrite(puVar10,1,sVar7,pFVar6);
                fclose(pFVar6);
              }
            }
          }
        }
        pcVar9 = opt.output_file;
        iVar8 = 0;
        if (opt.output_mode != 1) goto LAB_0010b66a;
        memset(local_3eb8,0,16000);
        if (opt.output_format == 0) {
          puVar10 = local_3eb8;
          iVar2 = mbedtls_pk_write_key_pem(&key,puVar10,16000);
          if (iVar2 == 0) {
            sVar7 = strlen((char *)puVar10);
            goto LAB_0010baad;
          }
        }
        else {
          uVar4 = mbedtls_pk_write_key_der(&key,local_3eb8,16000);
          if (-1 < (int)uVar4) {
            sVar7 = (size_t)uVar4;
            puVar10 = auStack_38 + -sVar7;
LAB_0010baad:
            pFVar6 = fopen(pcVar9,"w");
            if (pFVar6 != (FILE *)0x0) {
              fwrite(puVar10,1,sVar7,pFVar6);
              fclose(pFVar6);
            }
          }
        }
        iVar8 = 0;
        goto LAB_0010b66a;
      }
      mbedtls_strerror(iVar2,buf,0x400);
      printf(" failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n",(ulong)(uint)-iVar2,
             buf);
    }
    else {
      if (opt.mode != 2) goto LAB_0010b62f;
      printf("\n  . Loading the public key ...");
      fflush(_stdout);
      iVar2 = mbedtls_pk_parse_public_keyfile(&key,opt.filename);
      if (iVar2 == 0) {
        puts(" ok");
        puts("  . Key information    ...");
        mVar3 = mbedtls_pk_get_type(&key);
        if (mVar3 == MBEDTLS_PK_RSA) {
          iVar2 = mbedtls_rsa_export((mbedtls_rsa_context *)key.pk_ctx,&N,(mbedtls_mpi *)0x0,
                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&E);
          if (iVar2 != 0) goto LAB_0010b85d;
          mbedtls_mpi_write_file("N: ",&N,0x10,(FILE *)0x0);
          pcVar9 = "E: ";
          X = &E;
        }
        else {
          mVar3 = mbedtls_pk_get_type(&key);
          if (mVar3 != MBEDTLS_PK_ECKEY) goto LAB_0010b936;
          mbedtls_mpi_write_file
                    ("Q(X): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x110),0x10,(FILE *)0x0);
          mbedtls_mpi_write_file
                    ("Q(Y): ",(mbedtls_mpi *)((long)key.pk_ctx + 0x128),0x10,(FILE *)0x0);
          X = (mbedtls_mpi *)((long)key.pk_ctx + 0x140);
          pcVar9 = "Q(Z): ";
        }
        goto LAB_0010b96a;
      }
      mbedtls_strerror(iVar2,buf,0x400);
      printf(" failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n",
             (ulong)(uint)-iVar2,buf);
    }
  }
LAB_0010b642:
  iVar8 = 1;
  mbedtls_strerror(iVar2,buf,0x400);
  printf(" - %s\n",buf);
LAB_0010b66a:
  mbedtls_mpi_free(&N);
  mbedtls_mpi_free(&P);
  mbedtls_mpi_free(&Q);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&DP);
  mbedtls_mpi_free(&DQ);
  mbedtls_mpi_free(&QP);
  mbedtls_pk_free(&key);
  return iVar8;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    char buf[1024];
    int i;
    char *p, *q;

    mbedtls_pk_context key;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &key );
    memset( buf, 0, sizeof( buf ) );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.output_mode         = DFL_OUTPUT_MODE;
    opt.output_file         = DFL_OUTPUT_FILENAME;
    opt.output_format       = DFL_OUTPUT_FORMAT;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_format" ) == 0 )
        {
#if defined(MBEDTLS_PEM_WRITE_C)
            if( strcmp( q, "pem" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_PEM;
            else
#endif
            if( strcmp( q, "der" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "output_file" ) == 0 )
            opt.output_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_NONE && opt.output_mode != OUTPUT_MODE_NONE )
    {
        mbedtls_printf( "\nCannot output a key without reading one.\n");
        goto exit;
    }

    if( opt.mode == MODE_PUBLIC && opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        mbedtls_printf( "\nCannot output a private key from a public key.\n");
        goto exit;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &key, opt.filename, NULL );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

            if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
                ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto exit;
            }

            mbedtls_mpi_write_file( "N:  ",  &N,  16, NULL );
            mbedtls_mpi_write_file( "E:  ",  &E,  16, NULL );
            mbedtls_mpi_write_file( "D:  ",  &D,  16, NULL );
            mbedtls_mpi_write_file( "P:  ",  &P,  16, NULL );
            mbedtls_mpi_write_file( "Q:  ",  &Q,  16, NULL );
            mbedtls_mpi_write_file( "DP: ",  &DP, 16, NULL );
            mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL );
            mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
            mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");

    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &key, opt.filename );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

            if( ( ret = mbedtls_rsa_export( rsa, &N, NULL, NULL,
                                            NULL, &E ) ) != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto exit;
            }
            mbedtls_mpi_write_file( "N: ", &N, 16, NULL );
            mbedtls_mpi_write_file( "E: ", &E, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");
    }
    else
        goto usage;

    if( opt.output_mode == OUTPUT_MODE_PUBLIC )
    {
        write_public_key( &key, opt.output_file );
    }
    if( opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        write_private_key( &key, opt.output_file );
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

    mbedtls_pk_free( &key );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}